

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

void __thiscall kj::VectorOutputStream::~VectorOutputStream(VectorOutputStream *this)

{
  ~VectorOutputStream(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

VectorOutputStream::~VectorOutputStream() noexcept(false) {}